

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O3

ScriptWitness * __thiscall
cfd::core::Transaction::SetScriptWitnessStack
          (ScriptWitness *__return_storage_ptr__,Transaction *this,uint32_t tx_in_index,
          uint32_t witness_index,ByteData *data)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  ScriptWitness local_48;
  
  ByteData::GetBytes(&local_60,data);
  SetScriptWitnessStack(&local_48,this,tx_in_index,witness_index,&local_60);
  if (local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[10])(this,8);
  __return_storage_ptr__->_vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_0067f138;
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (&__return_storage_ptr__->witness_stack_,&local_48.witness_stack_);
  local_48._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_0067f138;
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&local_48.witness_stack_);
  return __return_storage_ptr__;
}

Assistant:

const ScriptWitness Transaction::SetScriptWitnessStack(
    uint32_t tx_in_index, uint32_t witness_index, const ByteData &data) {
  const ScriptWitness &witness =
      SetScriptWitnessStack(tx_in_index, witness_index, data.GetBytes());
  CallbackStateChange(kStateChangeUpdateSignTxIn);
  return witness;
}